

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * __thiscall
Util::toString_abi_cxx11_(string *__return_storage_ptr__,Util *this,Anchor anchor)

{
  int src;
  stringstream str;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [128];
  ios_base local_120 [264];
  
  src = (int)this;
  if (src == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"AnchorNone","");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"AnchorBottom","");
    enumValueToString(src,2,&local_1c0,(stringstream *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"AnchorHeight","");
    enumValueToString(src,4,&local_1e0,(stringstream *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"AnchorLeft","");
    enumValueToString(src,0x10,&local_200,(stringstream *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"AnchorRight","");
    enumValueToString(src,0x20,&local_220,(stringstream *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"AnchorTop","");
    enumValueToString(src,1,&local_240,(stringstream *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"AnchorWidth","");
    enumValueToString(src,0x40,&local_260,(stringstream *)local_1a0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Util::toString(Anchor anchor)
{
	if (anchor == AnchorNone)
		return "AnchorNone";
	
	std::stringstream str;

	enumValueToString(anchor, AnchorBottom, "AnchorBottom", str);
	enumValueToString(anchor, AnchorHeight, "AnchorHeight", str);
	enumValueToString(anchor, AnchorLeft, "AnchorLeft", str);
	enumValueToString(anchor, AnchorRight, "AnchorRight", str);
	enumValueToString(anchor, AnchorTop, "AnchorTop", str);
	enumValueToString(anchor, AnchorWidth, "AnchorWidth", str, true);

	return str.str();
}